

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdphuff.c
# Opt level: O0

void jinit_phuff_decoder(j_decompress_ptr cinfo)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long in_RDI;
  int i;
  int ci;
  int *coef_bit_ptr;
  phuff_entropy_ptr_conflict entropy;
  int local_20;
  int local_1c;
  undefined4 *local_18;
  
  puVar1 = (undefined8 *)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x68);
  *(undefined8 **)(in_RDI + 0x250) = puVar1;
  *puVar1 = start_pass_phuff_decoder;
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    puVar1[(long)local_20 + 8] = 0;
  }
  uVar2 = (*(code *)**(undefined8 **)(in_RDI + 8))
                    (in_RDI,1,(long)(*(int *)(in_RDI + 0x38) << 7) << 2);
  *(undefined8 *)(in_RDI + 0xc0) = uVar2;
  local_18 = *(undefined4 **)(in_RDI + 0xc0);
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x38); local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 0x40; local_20 = local_20 + 1) {
      *local_18 = 0xffffffff;
      local_18 = local_18 + 1;
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_phuff_decoder(j_decompress_ptr cinfo)
{
  phuff_entropy_ptr entropy;
  int *coef_bit_ptr;
  int ci, i;

  entropy = (phuff_entropy_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(phuff_entropy_decoder));
  cinfo->entropy = (struct jpeg_entropy_decoder *)entropy;
  entropy->pub.start_pass = start_pass_phuff_decoder;

  /* Mark derived tables unallocated */
  for (i = 0; i < NUM_HUFF_TBLS; i++) {
    entropy->derived_tbls[i] = NULL;
  }

  /* Create progression status table */
  cinfo->coef_bits = (int (*)[DCTSIZE2])
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                cinfo->num_components * 2 * DCTSIZE2 *
                                sizeof(int));
  coef_bit_ptr = &cinfo->coef_bits[0][0];
  for (ci = 0; ci < cinfo->num_components; ci++)
    for (i = 0; i < DCTSIZE2; i++)
      *coef_bit_ptr++ = -1;
}